

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O1

void reslot_weapon(CHAR_DATA *ch)

{
  OBJ_DATA *pOVar1;
  OBJ_DATA *obj;
  
  pOVar1 = get_eq_char(ch,0x10);
  obj = get_eq_char(ch,0x12);
  if (obj != (OBJ_DATA *)0x0 && pOVar1 == (OBJ_DATA *)0x0) {
    unequip_char(ch,obj,false);
    equip_char(ch,obj,0x10,false);
    return;
  }
  return;
}

Assistant:

void reslot_weapon(CHAR_DATA *ch)
{
	OBJ_DATA *primary = get_eq_char(ch, WEAR_WIELD);
	OBJ_DATA *secondary = get_eq_char(ch, WEAR_DUAL_WIELD);

	if (primary == nullptr && secondary != nullptr)
	{
		unequip_char(ch, secondary, false);

		if (secondary == nullptr)
			return;

		equip_char(ch, secondary, WEAR_WIELD, false);

		primary = secondary;
		secondary = nullptr;
	}
}